

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

Instr * __thiscall Lowerer::LowerBrBMem(Lowerer *this,Instr *instr,JnHelperMethod helperMethod)

{
  code *pcVar1;
  bool bVar2;
  Opnd *pOVar3;
  undefined4 *puVar4;
  Instr *pIVar5;
  HelperCallOpnd *src1Opnd;
  StackSym *sym;
  RegOpnd *dstOpnd;
  Instr *instr_00;
  StackSym *symDst;
  Opnd *opndDst;
  Opnd *opndSrc;
  HelperCallOpnd *opndHelper;
  Instr *instrCall;
  Instr *instrPrev;
  JnHelperMethod helperMethod_local;
  Instr *instr_local;
  Lowerer *this_local;
  
  pOVar3 = IR::Instr::GetSrc1(instr);
  if (pOVar3 != (Opnd *)0x0) {
    pOVar3 = IR::Instr::GetSrc2(instr);
    if (pOVar3 == (Opnd *)0x0) goto LAB_007a9114;
  }
  AssertCount = AssertCount + 1;
  Js::Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 1;
  bVar2 = Js::Throw::ReportAssert
                    ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                     ,0x281b,"(instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr)",
                     "Expected 1 src opnds on BrB");
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar4 = 0;
LAB_007a9114:
  pIVar5 = LoadScriptContext(this,instr);
  pOVar3 = IR::Instr::UnlinkSrc1(instr);
  LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,pOVar3);
  src1Opnd = IR::HelperCallOpnd::New(helperMethod,this->m_func);
  sym = StackSym::New(TyVar,this->m_func);
  dstOpnd = IR::RegOpnd::New(sym,TyVar,this->m_func);
  instr_00 = IR::Instr::New(Call,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
  IR::Instr::InsertBefore(instr,instr_00);
  LowererMD::LowerCall(&this->m_lowererMD,instr_00,0);
  IR::Instr::SetSrc1(instr,&dstOpnd->super_Opnd);
  LowererMD::LowerCondBranch(&this->m_lowererMD,instr);
  return pIVar5;
}

Assistant:

IR::Instr* Lowerer::LowerBrBMem(IR::Instr * instr, IR::JnHelperMethod helperMethod)
{
    IR::Instr * instrPrev;
    IR::Instr * instrCall;
    IR::HelperCallOpnd  * opndHelper;
    IR::Opnd  * opndSrc;
    IR::Opnd  * opndDst;
    StackSym * symDst;
    AssertMsg(instr->GetSrc1() != nullptr && instr->GetSrc2() == nullptr, "Expected 1 src opnds on BrB");

    instrPrev = LoadScriptContext(instr);
    opndSrc = instr->UnlinkSrc1();
    m_lowererMD.LoadHelperArgument(instr, opndSrc);

    // Generate helper call to convert the unknown operand to boolean

    opndHelper = IR::HelperCallOpnd::New(helperMethod, this->m_func);
    symDst = StackSym::New(TyVar, this->m_func);
    opndDst = IR::RegOpnd::New(symDst, TyVar, this->m_func);
    instrCall = IR::Instr::New(Js::OpCode::Call, opndDst, opndHelper, this->m_func);

    instr->InsertBefore(instrCall);
    instrCall = m_lowererMD.LowerCall(instrCall, 0);

    // Branch on the result of the call

    instr->SetSrc1(opndDst);
    m_lowererMD.LowerCondBranch(instr);

    return instrPrev;
}